

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

void __thiscall irr::core::string<char>::string(string<char> *this,unsigned_long number)

{
  bool bVar1;
  char cVar2;
  unsigned_long uVar3;
  char cVar4;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  cVar4 = '\x01';
  if (9 < number) {
    uVar3 = number;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001ec0e4;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001ec0e4;
      }
      if (uVar3 < 10000) goto LAB_001ec0e4;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001ec0e4:
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,number);
  ::std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

explicit string(unsigned long number)
	{
		str = std::to_string(number);
	}